

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiEvent * __thiscall
smf::MidiFile::addMetaEvent
          (MidiFile *this,int aTrack,int aTick,int aType,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *metaData)

{
  uint uVar1;
  ulong uVar2;
  MidiEvent *pMVar3;
  uint number;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fulldata;
  uchar size [23];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  uchar local_48 [24];
  
  this->m_timemapvalid = false;
  number = *(int *)&(metaData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(metaData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = 0;
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  uVar1 = makeVLV(this,local_48,number);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             (long)(int)(number + (int)((long)(int)uVar1 + 2)));
  *local_68._M_impl.super__Vector_impl_data._M_start = 0xff;
  local_68._M_impl.super__Vector_impl_data._M_start[1] = (byte)aType & 0x7f;
  uVar2 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    local_68._M_impl.super__Vector_impl_data._M_start[uVar2 + 2] = local_48[uVar2];
  }
  uVar2 = 0;
  uVar4 = (ulong)number;
  if ((int)number < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    local_68._M_impl.super__Vector_impl_data._M_start[uVar2 + (long)(int)uVar1 + 2] =
         (metaData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar2];
  }
  pMVar3 = addEvent(this,aTrack,aTick,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  return pMVar3;
}

Assistant:

MidiEvent* MidiFile::addMetaEvent(int aTrack, int aTick, int aType,
		std::vector<uchar>& metaData) {
	m_timemapvalid = 0;
	int i;
	int length = (int)metaData.size();
	std::vector<uchar> fulldata;
	uchar size[23] = {0};
	int lengthsize = makeVLV(size, length);

	fulldata.resize(2+lengthsize+length);
	fulldata[0] = 0xff;
	fulldata[1] = aType & 0x7F;
	for (i=0; i<lengthsize; i++) {
		fulldata[2+i] = size[i];
	}
	for (i=0; i<length; i++) {
		fulldata[2+lengthsize+i] = metaData[i];
	}

	return addEvent(aTrack, aTick, fulldata);
}